

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassJacobian
          (KinDynComputations *this,MatrixDynSize *comJacobian)

{
  bool bVar1;
  ulong in_RSI;
  MatrixView<double> *in_stack_00000310;
  KinDynComputations *in_stack_00000318;
  MatrixStorageOrdering *in_stack_ffffffffffffffc0;
  MatrixDynSize *in_stack_ffffffffffffffc8;
  MatrixView<double> *in_stack_ffffffffffffffd0;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize(in_RSI,3);
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  bVar1 = getCenterOfMassJacobian(in_stack_00000318,in_stack_00000310);
  return bVar1;
}

Assistant:

bool KinDynComputations::getCenterOfMassJacobian(MatrixDynSize& comJacobian)
{
    comJacobian.resize(3,pimpl->m_robot_model.getNrOfDOFs()+6);

    return this->getCenterOfMassJacobian(MatrixView<double>(comJacobian));
}